

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O1

void __thiscall SQVM::CloseOuters(SQVM *this,SQObjectPtr *stackindex)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQObjectType SVar3;
  SQOuter *pSVar4;
  SQObjectPtr *pSVar5;
  SQTable *pSVar6;
  
  pSVar4 = this->_openouters;
  while ((pSVar4 != (SQOuter *)0x0 && (pSVar5 = pSVar4->_valptr, stackindex <= pSVar5))) {
    SVar2 = (pSVar4->_value).super_SQObject._type;
    pSVar6 = (pSVar4->_value).super_SQObject._unVal.pTable;
    (pSVar4->_value).super_SQObject._unVal = (pSVar5->super_SQObject)._unVal;
    SVar3 = (pSVar5->super_SQObject)._type;
    (pSVar4->_value).super_SQObject._type = SVar3;
    if ((SVar3 >> 0x1b & 1) != 0) {
      pSVar1 = &(((pSVar4->_value).super_SQObject._unVal.pTable)->super_SQDelegable).
                super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    if ((SVar2 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar6->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar6->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
    pSVar4->_valptr = &pSVar4->_value;
    this->_openouters = pSVar4->_next;
    pSVar1 = &(pSVar4->super_SQCollectable).super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar4->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted[2])(pSVar4);
    }
    pSVar4 = this->_openouters;
  }
  return;
}

Assistant:

void SQVM::CloseOuters(SQObjectPtr *stackindex) {
  SQOuter *p;
  while ((p = _openouters) != NULL && p->_valptr >= stackindex) {
    p->_value = *(p->_valptr);
    p->_valptr = &p->_value;
    _openouters = p->_next;
    __ObjRelease(p);
  }
}